

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cpp
# Opt level: O2

void __thiscall
CMU462::DynamicScene::Skeleton::setSelection(Skeleton *this,int pickID,Selection *selection)

{
  iterator iVar1;
  mapped_type *ppJVar2;
  int local_1c;
  
  local_1c = pickID;
  iVar1 = std::
          _Rb_tree<int,_std::pair<const_int,_CMU462::DynamicScene::Joint_*>,_std::_Select1st<std::pair<const_int,_CMU462::DynamicScene::Joint_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_CMU462::DynamicScene::Joint_*>_>_>
          ::find(&(this->idToJoint)._M_t,&local_1c);
  if ((_Rb_tree_header *)iVar1._M_node != &(this->idToJoint)._M_t._M_impl.super__Rb_tree_header) {
    (selection->coordinates).x = 0.0;
    (selection->coordinates).y = 0.0;
    selection->object = (SceneObject *)0x0;
    selection->element = (HalfedgeElement *)0x0;
    (selection->coordinates).z = 0.0;
    selection->axis = None;
    ppJVar2 = std::
              map<int,_CMU462::DynamicScene::Joint_*,_std::less<int>,_std::allocator<std::pair<const_int,_CMU462::DynamicScene::Joint_*>_>_>
              ::operator[](&this->idToJoint,&local_1c);
    selection->object = &(*ppJVar2)->super_SceneObject;
  }
  return;
}

Assistant:

void Skeleton::setSelection(int pickID, Selection& selection)
  {
    // Set the selection to the joint specified by the given picking ID;
    // these values were generated in Skeleton::draw_pick.
    if (idToJoint.find(pickID) != idToJoint.end())
    {
      selection.clear();
      selection.object = idToJoint[pickID];
    }
  }